

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

void __thiscall enact::Parser::Parser(Parser *this,CompileContext *context)

{
  string local_38;
  
  this->m_context = context;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"");
  Lexer::Lexer(&this->m_scanner,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  (this->m_previous).type = LEFT_PAREN;
  (this->m_previous).lexeme._M_dataplus._M_p = (pointer)&(this->m_previous).lexeme.field_2;
  (this->m_previous).lexeme._M_string_length = 0;
  (this->m_previous).lexeme.field_2._M_local_buf[0] = '\0';
  (this->m_previous).line = 0;
  (this->m_previous).col = 0;
  (this->m_current).type = LEFT_PAREN;
  (this->m_current).lexeme._M_dataplus._M_p = (pointer)&(this->m_current).lexeme.field_2;
  (this->m_current).lexeme._M_string_length = 0;
  (this->m_current).lexeme.field_2._M_local_buf[0] = '\0';
  (this->m_current).line = 0;
  (this->m_current).col = 0;
  this->m_hadError = false;
  return;
}

Assistant:

Parser::Parser(CompileContext &context) : m_context{context} {
    }